

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O3

HeapType __thiscall
wasm::UniqueDeferredQueue<wasm::HeapType>::pop(UniqueDeferredQueue<wasm::HeapType> *this)

{
  _Map_pointer ppHVar1;
  _Elt_pointer pHVar2;
  uintptr_t in_RAX;
  mapped_type *pmVar3;
  key_type local_28;
  HeapType item;
  
  local_28.id = in_RAX;
  do {
    ppHVar1 = (this->data).c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    pHVar2 = (this->data).c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    if (((long)(this->data).c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last - (long)pHVar2 >> 3) +
        ((long)(this->data).c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->data).c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)ppHVar1 -
                  (long)(this->data).c.
                        super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppHVar1 == (_Map_pointer)0x0)) * 0x40 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,"T wasm::UniqueDeferredQueue<wasm::HeapType>::pop() [T = wasm::HeapType]")
      ;
    }
    local_28.id = pHVar2->id;
    pmVar3 = std::__detail::
             _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,&local_28);
    *pmVar3 = *pmVar3 - 1;
    std::deque<wasm::HeapType,_std::allocator<wasm::HeapType>_>::pop_front
              ((deque<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this);
    pmVar3 = std::__detail::
             _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->count,&local_28);
  } while (*pmVar3 != 0);
  return (HeapType)local_28.id;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }